

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O3

int ngram_ord_comparator(void *a_raw,void *b_raw)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = *(uint *)((long)a_raw + 0x10);
  if ((ulong)uVar1 != 0) {
    uVar4 = 0;
    do {
      if (*(uint *)((long)b_raw + 0x10) == uVar4) break;
      uVar2 = *(uint *)(*a_raw + uVar4 * 4);
      uVar3 = *(uint *)(*b_raw + uVar4 * 4);
      if (uVar2 != uVar3) {
        return -(uint)(uVar2 < uVar3) | 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return uVar1 - *(uint *)((long)b_raw + 0x10);
}

Assistant:

int
ngram_ord_comparator(const void *a_raw, const void *b_raw)
{
    ngram_raw_t *a = (ngram_raw_t *) a_raw;
    ngram_raw_t *b = (ngram_raw_t *) b_raw;
    int a_w_ptr = 0;
    int b_w_ptr = 0;
    while ((uint32)a_w_ptr < a->order && (uint32)b_w_ptr < b->order) {
        if (a->words[a_w_ptr] == b->words[b_w_ptr]) {
            a_w_ptr++;
            b_w_ptr++;
            continue;
        }
        if (a->words[a_w_ptr] < b->words[b_w_ptr])
            return -1;
        else
            return 1;
    }
    return a->order - b->order;
}